

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O1

TestStatus *
vkt::api::anon_unknown_1::createMaxConcurrentTest<vkt::api::(anonymous_namespace)::DescriptorSet>
          (TestStatus *__return_storage_ptr__,Context *context,Parameters *params)

{
  int *piVar1;
  PlatformInterface *pPVar2;
  long *plVar3;
  pointer pSVar4;
  Context *context_00;
  VkAllocationCallbacks *allocator;
  DeviceInterface *vk;
  VkDevice device;
  size_t sVar5;
  size_t sVar6;
  char *__s;
  size_t sVar7;
  deUint64 *pdVar8;
  long *plVar9;
  ulong uVar10;
  long lVar11;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
  objects;
  Resources res;
  Environment env;
  Resources res_1;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
  local_308;
  deUint64 dStack_2f0;
  TestStatus *local_2e0;
  Context *local_2d8;
  ulong local_2d0;
  undefined1 local_2c8 [24];
  VkDescriptorPool VStack_2b0;
  VkDescriptorSetLayout *local_2a8;
  Move<vk::Handle<(vk::HandleType)22>_> local_298;
  undefined1 local_270 [136];
  PlatformInterface *local_1e8;
  DeviceInterface *local_1e0;
  VkDevice local_1d8;
  deUint32 local_1d0;
  ProgramCollection<vk::ProgramBinary> *local_1c8;
  undefined1 *local_1c0;
  undefined4 local_1b8;
  undefined1 local_1b0 [8];
  Handle<(vk::HandleType)21> local_1a8;
  VkDescriptorPool local_1a0;
  deUint32 local_198;
  VkAllocationCallbacks *local_190;
  VkDescriptorSetLayout local_148 [2];
  ios_base local_138 [264];
  
  local_2e0 = __return_storage_ptr__;
  allocator = ::vk::getSystemAllocator();
  ::vk::AllocationCallbackRecorder::AllocationCallbackRecorder
            ((AllocationCallbackRecorder *)local_270,allocator,0x400);
  pPVar2 = context->m_platformInterface;
  vk = Context::getDeviceInterface(context);
  device = Context::getDevice(context);
  local_1d0 = Context::getUniversalQueueFamilyIndex(context);
  local_1c8 = context->m_progCollection;
  local_1c0 = local_270 + 8;
  local_1b8 = 1;
  local_2d8 = context;
  local_1e8 = pPVar2;
  local_1e0 = vk;
  local_1d8 = device;
  DescriptorSet::Resources::Resources((Resources *)local_1b0,(Environment *)&local_1e8,params);
  sVar5 = getCurrentSystemMemoryUsage((AllocationCallbackRecorder *)local_270);
  local_2c8._0_4_ = 0x22;
  local_2c8._8_8_ = (DeviceInterface *)0x0;
  local_2a8 = local_148;
  local_2c8._16_8_ = local_1a8.m_internal;
  VStack_2b0.m_internal._0_4_ = 1;
  ::vk::allocateDescriptorSet(&local_298,vk,device,(VkDescriptorSetAllocateInfo *)local_2c8);
  local_308.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)local_298.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal;
  local_308.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)local_298.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
                m_deviceIface;
  local_308.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)local_298.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device;
  dStack_2f0 = local_298.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.
               m_internal;
  sVar6 = getCurrentSystemMemoryUsage((AllocationCallbackRecorder *)local_270);
  context_00 = local_2d8;
  if (local_308.
      super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    local_2c8._0_8_ =
         local_308.
         super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (*(code *)(local_308.
               super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)->m_ptr[0xf].
              super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_deviceIface)
              (local_308.
               super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               local_308.
               super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,dStack_2f0,1);
  }
  DescriptorSet::Resources::~Resources((Resources *)local_1b0);
  ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder
            ((AllocationCallbackRecorder *)local_270);
  sVar5 = getSafeObjectCount(context_00,sVar6 - sVar5,0);
  local_2d0 = 0x4000;
  if (sVar5 < 0x4000) {
    local_2d0 = sVar5;
  }
  local_1e8 = context_00->m_platformInterface;
  local_1e0 = Context::getDeviceInterface(context_00);
  local_1d8 = Context::getDevice(context_00);
  local_1d0 = Context::getUniversalQueueFamilyIndex(context_00);
  local_1c8 = context_00->m_progCollection;
  local_1c0 = (undefined1 *)0x0;
  local_1b8 = (undefined4)local_2d0;
  DescriptorSet::Resources::Resources((Resources *)local_270,(Environment *)&local_1e8,params);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
  ::vector(&local_308,local_2d0,(allocator_type *)local_1b0);
  local_1b0 = (undefined1  [8])context_00->m_testCtx->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"Creating ",9);
  std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," ",1);
  __s = ::vk::getTypeName<vk::Handle<(vk::HandleType)22>>();
  if (__s == (char *)0x0) {
    std::ios::clear((int)(ostringstream *)&local_1a8 +
                    (int)*(undefined8 *)(local_1a8.m_internal - 0x18));
  }
  else {
    sVar7 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,__s,sVar7);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," objects",8);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  std::ios_base::~ios_base(local_138);
  if (sVar5 != 0) {
    lVar11 = 8;
    uVar10 = 0;
    do {
      pdVar8 = (deUint64 *)operator_new(0x20);
      local_1b0._0_4_ = 0x22;
      local_1a8.m_internal = 0;
      local_1a0.m_internal = local_270._8_8_;
      local_198 = 1;
      local_190 = (VkAllocationCallbacks *)(local_270 + 0x68);
      ::vk::allocateDescriptorSet
                ((Move<vk::Handle<(vk::HandleType)22>_> *)local_2c8,local_1e0,local_1d8,
                 (VkDescriptorSetAllocateInfo *)local_1b0);
      pdVar8[2] = local_2c8._16_8_;
      pdVar8[3] = VStack_2b0.m_internal;
      *pdVar8 = local_2c8._0_8_;
      pdVar8[1] = local_2c8._8_8_;
      local_2c8._0_8_ = (pointer)0x0;
      local_2c8._8_8_ = (DeviceInterface *)0x0;
      local_2c8._16_8_ = 0;
      VStack_2b0.m_internal = 0;
      plVar9 = (long *)operator_new(0x20);
      pSVar4 = local_308.
               super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(undefined4 *)(plVar9 + 1) = 0;
      *(undefined4 *)((long)plVar9 + 0xc) = 0;
      *plVar9 = (long)&PTR__SharedPtrState_00d53860;
      plVar9[2] = (long)pdVar8;
      *(undefined4 *)(plVar9 + 1) = 1;
      *(undefined4 *)((long)plVar9 + 0xc) = 1;
      plVar3 = *(long **)((long)&(local_308.
                                  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar11);
      if (plVar3 != plVar9) {
        if (plVar3 != (long *)0x0) {
          LOCK();
          plVar3 = plVar3 + 1;
          *(int *)plVar3 = (int)*plVar3 + -1;
          UNLOCK();
          if ((int)*plVar3 == 0) {
            *(undefined8 *)
             ((long)local_308.
                    super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar11 + -8) = 0;
            (**(code **)(**(long **)((long)&(local_308.
                                             super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->m_ptr +
                                    lVar11) + 0x10))();
          }
          LOCK();
          piVar1 = (int *)(*(long *)((long)&pSVar4->m_ptr + lVar11) + 0xc);
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            plVar3 = *(long **)((long)&pSVar4->m_ptr + lVar11);
            if (plVar3 != (long *)0x0) {
              (**(code **)(*plVar3 + 8))();
            }
            *(undefined8 *)((long)&pSVar4->m_ptr + lVar11) = 0;
          }
        }
        *(deUint64 **)((long)pSVar4 + lVar11 + -8) = pdVar8;
        *(long **)((long)&pSVar4->m_ptr + lVar11) = plVar9;
        LOCK();
        *(int *)(plVar9 + 1) = (int)plVar9[1] + 1;
        UNLOCK();
        LOCK();
        piVar1 = (int *)(*(long *)((long)&pSVar4->m_ptr + lVar11) + 0xc);
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      LOCK();
      plVar3 = plVar9 + 1;
      *(int *)plVar3 = (int)*plVar3 + -1;
      UNLOCK();
      if ((int)*plVar3 == 0) {
        (**(code **)(*plVar9 + 0x10))(plVar9);
      }
      LOCK();
      piVar1 = (int *)((long)plVar9 + 0xc);
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        (**(code **)(*plVar9 + 8))(plVar9);
      }
      if ((pointer)local_2c8._0_8_ != (pointer)0x0) {
        local_1b0 = (undefined1  [8])local_2c8._0_8_;
        (*(*(_func_int ***)local_2c8._8_8_)[0x3d])
                  (local_2c8._8_8_,local_2c8._16_8_,VStack_2b0.m_internal,1,local_1b0);
      }
      if ((uVar10 & 0x3ff) == 0 && uVar10 != 0) {
        tcu::TestContext::touchWatchdog(local_2d8->m_testCtx);
      }
      uVar10 = uVar10 + 1;
      lVar11 = lVar11 + 0x10;
    } while (local_2d0 != uVar10);
  }
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
  ::_M_erase_at_end(&local_308,
                    local_308.
                    super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  local_1b0 = (undefined1  [8])&local_1a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"Ok","");
  local_2e0->m_code = QP_TEST_RESULT_PASS;
  (local_2e0->m_description)._M_dataplus._M_p = (pointer)&(local_2e0->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2e0->m_description,local_1b0,
             (long)(deUint64 *)local_1b0 + local_1a8.m_internal);
  if (local_1b0 != (undefined1  [8])&local_1a0) {
    operator_delete((void *)local_1b0,(ulong)(local_1a0.m_internal + 1));
  }
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
  ::~vector(&local_308);
  DescriptorSet::Resources::~Resources((Resources *)local_270);
  return local_2e0;
}

Assistant:

tcu::TestStatus createMaxConcurrentTest (Context& context, typename Object::Parameters params)
{
	typedef Unique<typename Object::Type>	UniqueObject;
	typedef SharedPtr<UniqueObject>			ObjectPtr;

	const deUint32						numObjects			= Object::getMaxConcurrent(context, params);
	const Environment					env					(context, numObjects);
	const typename Object::Resources	res					(env, params);
	vector<ObjectPtr>					objects				(numObjects);
	const deUint32						watchdogInterval	= 1024;

	context.getTestContext().getLog()
		<< TestLog::Message << "Creating " << numObjects << " " << getTypeName<typename Object::Type>() << " objects" << TestLog::EndMessage;

	for (deUint32 ndx = 0; ndx < numObjects; ndx++)
	{
		objects[ndx] = ObjectPtr(new UniqueObject(Object::create(env, res, params)));

		if ((ndx > 0) && ((ndx % watchdogInterval) == 0))
			context.getTestContext().touchWatchdog();
	}

	objects.clear();

	return tcu::TestStatus::pass("Ok");
}